

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimerinfo_unix.cpp
# Opt level: O2

optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> __thiscall
QTimerInfoList::timerWait(QTimerInfoList *this)

{
  QTimerInfo **ppQVar1;
  long lVar2;
  undefined4 uVar3;
  QTimerInfo **ppQVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar8;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  (this->currentTime).__d.__r = lVar2;
  ppQVar4 = (this->timers).d.ptr;
  lVar7 = (this->timers).d.size;
  ppQVar1 = ppQVar4 + lVar7;
  lVar5 = lVar7 << 3;
  for (lVar7 = lVar7 >> 2; 0 < lVar7; lVar7 = lVar7 + -1) {
    if ((*ppQVar4)->activateRef == (QTimerInfo **)0x0) goto LAB_0037a1e8;
    if (ppQVar4[1]->activateRef == (QTimerInfo **)0x0) {
      ppQVar4 = ppQVar4 + 1;
      goto LAB_0037a1e8;
    }
    if (ppQVar4[2]->activateRef == (QTimerInfo **)0x0) {
      ppQVar4 = ppQVar4 + 2;
      goto LAB_0037a1e8;
    }
    if (ppQVar4[3]->activateRef == (QTimerInfo **)0x0) {
      ppQVar4 = ppQVar4 + 3;
      goto LAB_0037a1e8;
    }
    ppQVar4 = ppQVar4 + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 == 1) {
LAB_0037a1ca:
    if ((*ppQVar4)->activateRef != (QTimerInfo **)0x0) {
      ppQVar4 = ppQVar1;
    }
LAB_0037a1e8:
    if (ppQVar4 != ppQVar1) {
      lVar7 = ((*ppQVar4)->timeout).__d.__r;
      uVar3 = (undefined4)CONCAT71((int7)((ulong)*ppQVar4 >> 8),1);
      uVar6 = lVar7 - lVar2;
      if (uVar6 == 0 || lVar7 < lVar2) {
        lVar2 = 0;
      }
      else {
        lVar2 = (uVar6 / 1000000 + (ulong)((uVar6 / 1000000) * 1000000 < uVar6)) * 1000000;
      }
      goto LAB_0037a224;
    }
  }
  else {
    if (lVar5 == 2) {
LAB_0037a1bc:
      if ((*ppQVar4)->activateRef != (QTimerInfo **)0x0) {
        ppQVar4 = ppQVar4 + 1;
        goto LAB_0037a1ca;
      }
      goto LAB_0037a1e8;
    }
    if (lVar5 == 3) {
      if ((*ppQVar4)->activateRef != (QTimerInfo **)0x0) {
        ppQVar4 = ppQVar4 + 1;
        goto LAB_0037a1bc;
      }
      goto LAB_0037a1e8;
    }
  }
  uVar3 = 0;
LAB_0037a224:
  oVar8.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>._8_4_ =
       uVar3;
  oVar8.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
  _M_payload = (_Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>)lVar2;
  oVar8.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>._12_4_ =
       0;
  return (optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
         oVar8.
         super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>;
}

Assistant:

std::optional<QTimerInfoList::Duration> QTimerInfoList::timerWait()
{
    steady_clock::time_point now = updateCurrentTime();

    auto isWaiting = [](QTimerInfo *tinfo) { return !tinfo->activateRef; };
    // Find first waiting timer not already active
    auto it = std::find_if(timers.cbegin(), timers.cend(), isWaiting);
    if (it == timers.cend())
        return std::nullopt;

    Duration timeToWait = (*it)->timeout - now;
    if (timeToWait > 0ns)
        return roundToMillisecond(timeToWait);
    return 0ms;
}